

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::Clean(NaStateSpaceModel *this)

{
  NaReal *pNVar1;
  NaMatrix *in_RDI;
  NaUnit *unaff_retaddr;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  NaMatrix *pNVar2;
  
  pNVar2 = in_RDI;
  NaMatrix::new_dim((NaMatrix *)unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  NaMatrix::new_dim((NaMatrix *)unaff_retaddr,(uint)((ulong)pNVar2 >> 0x20),(uint)pNVar2);
  NaMatrix::new_dim((NaMatrix *)unaff_retaddr,(uint)((ulong)pNVar2 >> 0x20),(uint)pNVar2);
  NaMatrix::new_dim((NaMatrix *)unaff_retaddr,(uint)((ulong)pNVar2 >> 0x20),(uint)pNVar2);
  *(undefined4 *)&in_RDI[3]._vptr_NaMatrix = 1;
  *(undefined4 *)((long)&in_RDI[2].pMatr + 4) = 1;
  *(undefined4 *)&in_RDI[2].pMatr = 1;
  NaUnit::Assign(unaff_retaddr,(uint)((ulong)pNVar2 >> 0x20),(uint)pNVar2,
                 (uint)((ulong)in_RDI >> 0x20));
  pNVar1 = NaMatrix::fetch(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *pNVar1 = 0.0;
  return;
}

Assistant:

void
NaStateSpaceModel::Clean ()
{
    A.new_dim(1, 1);
    B.new_dim(1, 1);
    C.new_dim(1, 1);
    D.new_dim(1, 1);

    n = m = k = 1;
    Assign(k, m);

    A.fetch(0,0) = 0.0;
    B.fetch(0,0) = 0.0;
    C.fetch(0,0) = 0.0;
    D.fetch(0,0) = 0.0;
}